

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

bool cmFortranParser_FilePush(cmFortranParser *parser,char *fname)

{
  undefined8 buffer_00;
  FILE *pFVar1;
  YY_BUFFER_STATE new_buffer;
  YY_BUFFER_STATE buffer;
  undefined1 local_e8 [8];
  cmFortranFile f;
  string local_a8;
  undefined1 local_88 [8];
  string dir;
  YY_BUFFER_STATE current;
  allocator<char> local_49;
  string local_48;
  FILE *local_28;
  FILE *file;
  char *fname_local;
  cmFortranParser *parser_local;
  
  file = (FILE *)fname;
  fname_local = (char *)parser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,fname,&local_49);
  pFVar1 = cmsys::SystemTools::Fopen(&local_48,"rb");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (pFVar1 == (FILE *)0x0) {
    parser_local._7_1_ = 0;
  }
  else {
    local_28 = pFVar1;
    dir.field_2._8_8_ = cmFortranLexer_GetCurrentBuffer(*(yyscan_t *)(fname_local + 0x78));
    pFVar1 = file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,(char *)pFVar1,(allocator<char> *)&f.field_0x37);
    cmsys::SystemTools::GetParentDirectory((string *)local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&f.field_0x37);
    pFVar1 = local_28;
    buffer_00 = dir.field_2._8_8_;
    std::__cxx11::string::string((string *)&buffer,(string *)local_88);
    cmFortranFile::cmFortranFile
              ((cmFortranFile *)local_e8,pFVar1,(YY_BUFFER_STATE)buffer_00,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    new_buffer = cmFortran_yy_create_buffer((FILE *)0x0,0x4000,*(yyscan_t *)(fname_local + 0x78));
    cmFortran_yy_switch_to_buffer(new_buffer,*(yyscan_t *)(fname_local + 0x78));
    std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::push
              ((stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_> *)
               (fname_local + 0x80),(value_type *)local_e8);
    parser_local._7_1_ = 1;
    cmFortranFile::~cmFortranFile((cmFortranFile *)local_e8);
    std::__cxx11::string::~string((string *)local_88);
  }
  return (bool)(parser_local._7_1_ & 1);
}

Assistant:

bool cmFortranParser_FilePush(cmFortranParser* parser, const char* fname)
{
  // Open the new file and push it onto the stack.  Save the old
  // buffer with it on the stack.
  if (FILE* file = cmsys::SystemTools::Fopen(fname, "rb")) {
    YY_BUFFER_STATE current = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::string dir = cmSystemTools::GetParentDirectory(fname);
    cmFortranFile f(file, current, dir);
    YY_BUFFER_STATE buffer =
      cmFortran_yy_create_buffer(nullptr, 16384, parser->Scanner);
    cmFortran_yy_switch_to_buffer(buffer, parser->Scanner);
    parser->FileStack.push(f);
    return true;
  }
  return false;
}